

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ios_prop.h
# Opt level: O0

void booster::locale::impl::ios_prop<propery>::callback(event ev,ios_base *ios,int id)

{
  bool bVar1;
  void **ppvVar2;
  propery *ppVar3;
  int in_EDI;
  ios_base *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc8;
  int __ix;
  ios_base *in_stack_ffffffffffffffd0;
  
  __ix = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (in_EDI == 0) {
    bVar1 = has(in_stack_ffffffffffffffb8);
    if (bVar1) {
      ppvVar2 = std::ios_base::pword(in_stack_ffffffffffffffd0,__ix);
      ppVar3 = (propery *)*ppvVar2;
      if (ppVar3 != (propery *)0x0) {
        propery::~propery(ppVar3);
        operator_delete(ppVar3);
      }
    }
  }
  else if (in_EDI == 1) {
    ppvVar2 = std::ios_base::pword(in_stack_ffffffffffffffd0,__ix);
    if ((*ppvVar2 != (void *)0xffffffffffffffff) &&
       (ppvVar2 = std::ios_base::pword(in_stack_ffffffffffffffd0,__ix), *ppvVar2 != (void *)0x0)) {
      ppvVar2 = std::ios_base::pword(in_stack_ffffffffffffffd0,__ix);
      propery::on_imbue((propery *)*ppvVar2);
    }
  }
  else if (((in_EDI == 2) &&
           (ppvVar2 = std::ios_base::pword(in_stack_ffffffffffffffd0,__ix),
           *ppvVar2 != (void *)0xffffffffffffffff)) &&
          (ppvVar2 = std::ios_base::pword(in_stack_ffffffffffffffd0,__ix), *ppvVar2 != (void *)0x0))
  {
    ppVar3 = (propery *)operator_new(4);
    ppvVar2 = std::ios_base::pword(in_stack_ffffffffffffffd0,__ix);
    propery::propery(ppVar3,(propery *)*ppvVar2);
    ppvVar2 = std::ios_base::pword(in_stack_ffffffffffffffd0,(int)((ulong)ppvVar2 >> 0x20));
    *ppvVar2 = ppVar3;
  }
  return;
}

Assistant:

static void callback(std::ios_base::event ev,std::ios_base &ios,int id)
                {
                    switch(ev) {
                    case std::ios_base::erase_event:
                        if(!has(ios))
                            break;
                        delete reinterpret_cast<Property *>(ios.pword(id));
                        break;
                    case std::ios_base::copyfmt_event:
                        if(ios.pword(id)==invalid || ios.pword(id)==0)
                            break;
                        ios.pword(id)=new Property(*reinterpret_cast<Property *>(ios.pword(id)));
                        break;
                    case std::ios_base::imbue_event:
                        if(ios.pword(id)==invalid || ios.pword(id)==0)
                            break;
                        reinterpret_cast<Property *>(ios.pword(id))->on_imbue(); 
                        break;
                        
                    default: ;
                    }
                }